

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O0

int Gia_ManIteratePaths(Gia_Man_t *p,int DelayC,int nPathMin,int nPathMax,int nPathLimit,
                       int fIgnoreBoxDelays,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  ulong uVar5;
  bool bVar6;
  uint local_4c;
  int nPaths;
  int MaxDelay;
  int nBoxes;
  int RetValue;
  int i;
  Vec_Int_t *vPath;
  Gia_Obj_t *pObj;
  uint local_20;
  int fIgnoreBoxDelays_local;
  int nPathLimit_local;
  int nPathMax_local;
  int nPathMin_local;
  int DelayC_local;
  Gia_Man_t *p_local;
  
  pObj._4_4_ = fIgnoreBoxDelays;
  local_20 = nPathLimit;
  fIgnoreBoxDelays_local = nPathMax;
  nPathLimit_local = nPathMin;
  nPathMax_local = DelayC;
  _nPathMin_local = p;
  _RetValue = Vec_IntAlloc(100);
  local_4c = 0;
  if (_nPathMin_local->vLevels != (Vec_Int_t *)0x0) {
    __assert_fail("p->vLevels == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecFadds.c"
                  ,0x4b1,"int Gia_ManIteratePaths(Gia_Man_t *, int, int, int, int, int, int)");
  }
  iVar1 = Gia_ManObjNum(_nPathMin_local);
  pVVar4 = Vec_IntStart(iVar1);
  _nPathMin_local->vLevels = pVVar4;
  Gia_ManCleanMark01(_nPathMin_local);
  Gia_ManCleanPhase(_nPathMin_local);
  nBoxes = 0;
  while( true ) {
    iVar1 = nBoxes;
    iVar2 = Vec_IntSize(_nPathMin_local->vCis);
    bVar6 = false;
    if (iVar1 < iVar2) {
      vPath = (Vec_Int_t *)Gia_ManCi(_nPathMin_local,nBoxes);
      bVar6 = vPath != (Vec_Int_t *)0x0;
    }
    if (!bVar6) break;
    uVar5._0_4_ = vPath->nCap;
    uVar5._4_4_ = vPath->nSize;
    uVar5 = uVar5 & 0x7fffffffffffffff | 0x8000000000000000;
    vPath->nCap = (int)uVar5;
    vPath->nSize = (int)(uVar5 >> 0x20);
    nBoxes = nBoxes + 1;
  }
  if (fVerbose != 0) {
    printf("Running path detection: BoxDelay = %d, PathMin = %d, PathMax = %d, PathLimit = %d.\n",
           (ulong)(uint)nPathMax_local,(ulong)(uint)nPathLimit_local,
           (ulong)(uint)fIgnoreBoxDelays_local,(ulong)local_20);
  }
  for (nBoxes = 0; nBoxes < (int)local_20; nBoxes = nBoxes + 1) {
    uVar3 = Gia_ManFindAnnotatedDelay(_nPathMin_local,nPathMax_local,&nPaths,pObj._4_4_);
    MaxDelay = Gia_ManFindPath(_nPathMin_local,nPathMax_local,nPathLimit_local,
                               fIgnoreBoxDelays_local,_RetValue);
    if (MaxDelay == 0xffffffff) break;
    local_4c = (0 < MaxDelay) + local_4c;
    if (fVerbose != 0) {
      printf("Iter %5d : Paths = %2d. Boxes = %2d. Total boxes = %6d.  Max delay = %5d.\n",
             (ulong)(uint)nBoxes,(ulong)local_4c,(ulong)(uint)MaxDelay,(ulong)(uint)nPaths,
             (ulong)uVar3);
    }
  }
  Vec_IntFree(_RetValue);
  Vec_IntFreeP(&_nPathMin_local->vLevels);
  Gia_ManCleanPhase(_nPathMin_local);
  return 1;
}

Assistant:

int Gia_ManIteratePaths( Gia_Man_t * p, int DelayC, int nPathMin, int nPathMax, int nPathLimit, int fIgnoreBoxDelays, int fVerbose )
{
    Gia_Obj_t * pObj;
    Vec_Int_t * vPath = Vec_IntAlloc( 100 );
    int i, RetValue, nBoxes, MaxDelay, nPaths = 0;
    assert( p->vLevels == NULL );
    p->vLevels = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_ManCleanMark01( p );
    Gia_ManCleanPhase( p );
    Gia_ManForEachCi( p, pObj, i )
        pObj->fPhase = 1;
    if ( fVerbose )
        printf( "Running path detection: BoxDelay = %d, PathMin = %d, PathMax = %d, PathLimit = %d.\n", DelayC, nPathMin, nPathMax, nPathLimit );
    for ( i = 0; i < nPathLimit; i++ )
    {
        MaxDelay = Gia_ManFindAnnotatedDelay( p, DelayC, &nBoxes, fIgnoreBoxDelays );
        RetValue = Gia_ManFindPath( p, DelayC, nPathMin, nPathMax, vPath );
        if ( RetValue == -1 )
            break;
        nPaths += (RetValue > 0);
        if ( fVerbose )
            printf( "Iter %5d : Paths = %2d. Boxes = %2d. Total boxes = %6d.  Max delay = %5d.\n", i, nPaths, RetValue, nBoxes, MaxDelay );
    }
    Vec_IntFree( vPath );
    Vec_IntFreeP( &p->vLevels );
    Gia_ManCleanPhase( p );
    return 1;
}